

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

void __thiscall
kj::_::Delimited<kj::ArrayPtr<const_char16_t>_>::ensureStringifiedInitialized
          (Delimited<kj::ArrayPtr<const_char16_t>_> *this)

{
  CappedArray<char,_14UL> *pCVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  anon_class_1_0_00000001 local_29;
  Array<kj::CappedArray<char,_14UL>_> local_28;
  Mapper<kj::ArrayPtr<const_char16_t>_&> local_10;
  
  if (((this->array).size_ != 0) && ((this->stringified).size_ == 0)) {
    local_10.array = &this->array;
    Mapper<kj::ArrayPtr<const_char16_t>_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_string_h:886:21)>
              (&local_28,&local_10,&local_29);
    pCVar1 = (this->stringified).ptr;
    if (pCVar1 != (CappedArray<char,_14UL> *)0x0) {
      sVar2 = (this->stringified).size_;
      (this->stringified).ptr = (CappedArray<char,_14UL> *)0x0;
      (this->stringified).size_ = 0;
      pAVar3 = (this->stringified).disposer;
      (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pCVar1,0x18,sVar2,sVar2,0);
    }
    (this->stringified).ptr = local_28.ptr;
    (this->stringified).size_ = local_28.size_;
    (this->stringified).disposer = local_28.disposer;
  }
  return;
}

Assistant:

void ensureStringifiedInitialized() {
    if (array.size() > 0 && stringified.size() == 0) {
      stringified = KJ_MAP(e, array) { return toCharSequence(e); };
    }
  }